

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

void __thiscall
brotli::HashToBinaryTree::Init
          (HashToBinaryTree *this,int lgwin,size_t position,size_t bytes,bool is_last)

{
  uint32_t *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this->need_init_ == true) {
    uVar3 = -1 << ((byte)lgwin & 0x1f);
    uVar4 = (ulong)~uVar3;
    this->window_mask_ = uVar4;
    this->invalid_pos_ = uVar3 + 1;
    lVar2 = 0;
    do {
      this->buckets_[lVar2] = this->invalid_pos_;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20000);
    uVar4 = uVar4 + 1;
    if (!is_last) {
      bytes = uVar4;
    }
    if (position != 0) {
      bytes = uVar4;
    }
    puVar1 = (uint32_t *)operator_new__(-(ulong)((bytes & 0x6000000000000000) != 0) | bytes << 3);
    this->forest_ = puVar1;
    this->need_init_ = false;
  }
  return;
}

Assistant:

void Init(int lgwin, size_t position, size_t bytes, bool is_last) {
    if (need_init_) {
      window_mask_ = (1u << lgwin) - 1u;
      invalid_pos_ = static_cast<uint32_t>(-window_mask_);
      for (uint32_t i = 0; i < kBucketSize; i++) {
        buckets_[i] = invalid_pos_;
      }
      size_t num_nodes = (position == 0 && is_last) ? bytes : window_mask_ + 1;
      forest_ = new uint32_t[2 * num_nodes];
      need_init_ = false;
    }
  }